

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

void __thiscall f8n::runtime::MessageQueue::MessageQueue(MessageQueue *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IMessageQueue)._vptr_IMessageQueue = (_func_int **)&PTR__MessageQueue_002158f8;
  (this->queueMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queueMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queueMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queueMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queueMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->queue).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->queue;
  (this->queue).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->queue;
  (this->queue).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->dispatch).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->dispatch;
  (this->dispatch).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->dispatch;
  (this->dispatch).
  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = &(this->receivers)._M_t._M_impl.super__Rb_tree_header;
  (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->targets)._M_t._M_impl.super__Rb_tree_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::_V2::condition_variable_any::condition_variable_any(&this->waitForDispatch);
  LOCK();
  (this->nextMessageTime).super___atomic_base<long>._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

MessageQueue::MessageQueue() {
    this->nextMessageTime.store(1);
}